

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CNode::MarkReceivedMsgsForProcessing(CNode *this)

{
  list<CNetMessage,_std::allocator<CNetMessage>_> *plVar1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock102;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_msg_process_queue_mutex).super_mutex;
  plVar1 = &this->vRecvMsg;
  lVar5 = 0;
  for (p_Var4 = (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl
                ._M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)plVar1;
      p_Var4 = p_Var4->_M_next) {
    lVar5 = lVar5 + (ulong)*(uint *)((long)&p_Var4[3]._M_prev + 4);
  }
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  p_Var3 = (_List_node_base *)
           (plVar1->super__List_base<CNetMessage,_std::allocator<CNetMessage>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)plVar1) {
    std::__detail::_List_node_base::_M_transfer
              ((_List_node_base *)&this->m_msg_process_queue,p_Var3);
    psVar2 = &(this->m_msg_process_queue).
              super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>
                        ._M_impl._M_node._M_size;
    (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node.
    _M_size = 0;
  }
  uVar6 = lVar5 + this->m_msg_process_queue_size;
  this->m_msg_process_queue_size = uVar6;
  LOCK();
  (this->fPauseRecv)._M_base._M_i = this->m_recv_flood_size < uVar6;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNode::MarkReceivedMsgsForProcessing()
{
    AssertLockNotHeld(m_msg_process_queue_mutex);

    size_t nSizeAdded = 0;
    for (const auto& msg : vRecvMsg) {
        // vRecvMsg contains only completed CNetMessage
        // the single possible partially deserialized message are held by TransportDeserializer
        nSizeAdded += msg.m_raw_message_size;
    }

    LOCK(m_msg_process_queue_mutex);
    m_msg_process_queue.splice(m_msg_process_queue.end(), vRecvMsg);
    m_msg_process_queue_size += nSizeAdded;
    fPauseRecv = m_msg_process_queue_size > m_recv_flood_size;
}